

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlat_parser.c
# Opt level: O2

void XlatParse(void *yyp,int yymajor,FParseToken yyminor,FParseContext *context)

{
  byte bVar1;
  ushort uVar2;
  FParseContext *pFVar3;
  undefined1 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  FLineTrans val_00;
  undefined7 uVar10;
  int iVar11;
  long lVar12;
  ushort *puVar13;
  undefined8 *puVar14;
  int *piVar15;
  uint uVar16;
  int extraout_EDX;
  FSectorTrans val_01;
  undefined8 uVar17;
  uchar uVar18;
  ushort *puVar19;
  FParseToken *pFVar20;
  double *pdVar21;
  ushort *puVar22;
  ulong uVar23;
  ulong uVar24;
  undefined8 *puVar25;
  ulong uVar26;
  byte bVar27;
  undefined4 uVar28;
  FXlatExprState state;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined8 local_b8;
  undefined4 auStack_b0 [6];
  undefined8 local_98;
  undefined6 uStack_90;
  undefined2 uStack_8a;
  undefined6 uStack_88;
  int val;
  ulong local_58;
  ushort *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  bVar27 = 0;
  puVar22 = *yyp;
  if (puVar22 == (ushort *)0x0) {
    __assert_fail("yypParser->yytos!=0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O2/src/xlat_parser.c"
                  ,0x740,"void XlatParse(void *, int, FParseToken, FParseContext *)");
  }
  *(FParseContext **)((long)yyp + 0x10) = context;
  if (yyTraceFILE != (FILE *)0x0) {
    fprintf((FILE *)yyTraceFILE,"%sInput \'%s\'\n",yyTracePrompt,yyTokenName[yymajor]);
    fflush((FILE *)yyTraceFILE);
    puVar22 = *yyp;
  }
  local_40 = (long)yyp + 0x2220;
  puVar19 = (ushort *)((long)yyp + 0x18);
  local_38 = (ulong)(uint)yymajor & 0xff;
  local_50 = puVar19;
  do {
    uVar2 = *puVar22;
    if (uVar2 < 0xe9) {
      if (99 < uVar2) {
        __assert_fail("stateno <= YY_SHIFT_COUNT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O2/src/xlat_parser.c"
                      ,0x2ec,"unsigned int yy_find_shift_action(yyParser *, unsigned char)");
      }
      uVar18 = (uchar)yymajor;
      if (uVar18 == 'G') {
        __assert_fail("iLookAhead!=YYNOCODE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O2/src/xlat_parser.c"
                      ,0x2ef,"unsigned int yy_find_shift_action(yyParser *, unsigned char)");
      }
      lVar12 = yy_shift_ofst[uVar2] + local_38;
      if (((uint)lVar12 < 0x166) &&
         ("+,-./012345)*8:;\x02\x03\x04\x05\x06\a\b\t\x0f\x02\x03\x04\x05\x06\a\b\t\x02\x03\x04\x05\x06\a\b\t\x05\x06\a\b\t ABC$%&"
          [lVar12] == uVar18)) {
        puVar13 = yy_action + lVar12;
      }
      else {
        puVar13 = yy_default + uVar2;
      }
      uVar2 = *puVar13;
      if (0xe8 < uVar2) goto LAB_004ef729;
      pFVar20 = &yyminor;
      pdVar21 = (double *)&local_b8;
      for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
        *pdVar21 = pFVar20->fval;
        pFVar20 = (FParseToken *)((long)pFVar20 + (ulong)bVar27 * -0x10 + 8);
        pdVar21 = pdVar21 + (ulong)bVar27 * -2 + 1;
      }
      *(ushort **)yyp = puVar22 + 0x2c;
      if (puVar22 + 0x2c < (ushort *)((long)yyp + 0x2278U)) {
        uVar16 = uVar2 + 0x4e;
        if (uVar2 < 100) {
          uVar16 = (uint)uVar2;
        }
        puVar22[0x2c] = (ushort)uVar16;
        *(uchar *)(puVar22 + 0x2d) = uVar18;
        puVar14 = &local_b8;
        puVar22 = puVar22 + 0x30;
        for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
          *(undefined8 *)puVar22 = *puVar14;
          puVar14 = puVar14 + (ulong)bVar27 * -2 + 1;
          puVar22 = puVar22 + (ulong)bVar27 * -8 + 4;
        }
        yyTraceShift((yyParser *)yyp,uVar16);
      }
      else {
        yyStackOverflow((yyParser *)yyp);
      }
      iVar11 = *(int *)((long)yyp + 8) + -1;
LAB_004f0484:
      *(int *)((long)yyp + 8) = iVar11;
LAB_004f0487:
      if (yyTraceFILE != (FILE *)0x0) {
        fprintf((FILE *)yyTraceFILE,"%sReturn. Stack=",yyTracePrompt);
        uVar17 = 0x5b;
        for (uVar26 = (long)yyp + 0x70; uVar26 <= *yyp; uVar26 = uVar26 + 0x58) {
          fprintf((FILE *)yyTraceFILE,"%c%s",uVar17,yyTokenName[*(byte *)(uVar26 + 2)]);
          uVar17 = 0x20;
        }
        fwrite("]\n",2,1,(FILE *)yyTraceFILE);
        fflush((FILE *)yyTraceFILE);
      }
      return;
    }
LAB_004ef729:
    if (0x136 < uVar2) {
      if (uVar2 != 0x137) {
        __assert_fail("yyact == YY_ERROR_ACTION",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O2/src/xlat_parser.c"
                      ,0x758,"void XlatParse(void *, int, FParseToken, FParseContext *)");
      }
      if (yyTraceFILE != (FILE *)0x0) {
        fprintf((FILE *)yyTraceFILE,"%sSyntax Error!\n",yyTracePrompt);
        fflush((FILE *)yyTraceFILE);
      }
      if (*(int *)((long)yyp + 8) < 1) {
        pFVar3 = *(FParseContext **)((long)yyp + 0x10);
        FParseContext::PrintError(pFVar3,"syntax error");
        *(FParseContext **)((long)yyp + 0x10) = pFVar3;
      }
      *(undefined4 *)((long)yyp + 8) = 3;
      if (yymajor == 0) {
        uVar17 = *(undefined8 *)((long)yyp + 0x10);
        if (yyTraceFILE != (FILE *)0x0) {
          fprintf((FILE *)yyTraceFILE,"%sFail!\n",yyTracePrompt);
          fflush((FILE *)yyTraceFILE);
        }
        while (puVar19 < *yyp) {
          yy_pop_parser_stack((yyParser *)yyp);
        }
        *(undefined8 *)((long)yyp + 0x10) = uVar17;
        iVar11 = -1;
        goto LAB_004f0484;
      }
      goto LAB_004f0487;
    }
    uVar23 = (ulong)(uVar2 - 0xe9);
    pFVar3 = *(FParseContext **)((long)yyp + 0x10);
    bVar1 = yyRuleInfo[uVar23].nrhs;
    uVar26 = (ulong)bVar1;
    if (yyTraceFILE != (FILE *)0x0) {
      fprintf((FILE *)yyTraceFILE,"%sReduce [%s], go to state %d.\n",yyTracePrompt,
              _ZL10yyRuleName_rel + *(int *)(_ZL10yyRuleName_rel + uVar23 * 4),
              (ulong)puVar22[uVar26 * -0x2c]);
      fflush((FILE *)yyTraceFILE);
    }
    puVar14 = local_b8;
    if ((bVar1 == 0) && (local_40 <= *yyp)) {
      yyStackOverflow((yyParser *)yyp);
      puVar19 = local_50;
      goto LAB_004f00e3;
    }
    uVar10 = local_b8._1_7_;
    uVar28 = local_b8._4_4_;
    switch((uint)uVar2) {
    case 0xea:
      *(int *)(puVar22 + -0x54) = *(int *)(puVar22 + -0x54) + *(int *)(puVar22 + 4);
      break;
    case 0xeb:
      *(int *)(puVar22 + -0x54) = *(int *)(puVar22 + -0x54) - *(int *)(puVar22 + 4);
      break;
    case 0xec:
      uVar16 = *(int *)(puVar22 + 4) * *(int *)(puVar22 + -0x54);
      goto LAB_004eff1f;
    case 0xed:
      if (*(int *)(puVar22 + 4) == 0) {
        uVar16 = FParseContext::PrintError(pFVar3,"Division by zero");
      }
      else {
        uVar16 = *(int *)(puVar22 + -0x54) / *(int *)(puVar22 + 4);
      }
      goto LAB_004eff1f;
    case 0xee:
      if (*(int *)(puVar22 + 4) == 0) {
        FParseContext::PrintError(pFVar3,"Division by zero");
        iVar11 = extraout_EDX;
      }
      else {
        iVar11 = *(int *)(puVar22 + -0x54) % *(int *)(puVar22 + 4);
      }
      *(int *)(puVar22 + -0x54) = iVar11;
      break;
    case 0xef:
      *(uint *)(puVar22 + -0x54) = *(uint *)(puVar22 + -0x54) | *(uint *)(puVar22 + 4);
      break;
    case 0xf0:
      *(uint *)(puVar22 + -0x54) = *(uint *)(puVar22 + -0x54) & *(uint *)(puVar22 + 4);
      break;
    case 0xf1:
      *(uint *)(puVar22 + -0x54) = *(uint *)(puVar22 + -0x54) ^ *(uint *)(puVar22 + 4);
      break;
    case 0xf2:
      uVar16 = -*(int *)(puVar22 + 4);
      goto LAB_004efea5;
    case 0xf3:
    case 0x106:
      uVar16 = *(uint *)(puVar22 + -0x28);
      goto LAB_004eff1f;
    case 0xf4:
      puVar19 = puVar22 + -0x80;
      iVar11 = *(int *)(puVar22 + -0x28);
      goto LAB_004efd1d;
    case 0xf5:
      pFVar3->EnumVal = 0;
      break;
    case 0xf6:
      puVar19 = puVar22 + 4;
      iVar11 = pFVar3->EnumVal;
      pFVar3->EnumVal = iVar11 + 1;
LAB_004efd1d:
      FParseContext::AddSym(pFVar3,(char *)puVar19,iVar11);
      break;
    case 0xf7:
      FParseContext::AddSym(pFVar3,(char *)(puVar22 + -0x54),*(int *)(puVar22 + 4));
      pFVar3->EnumVal = *(int *)(puVar22 + 4) + 1;
      break;
    case 0xf8:
      uVar16 = *(uint *)(puVar22 + 4);
      *(uint *)&pFVar3[1]._vptr_FParseContext = uVar16;
      goto LAB_004efe5d;
    case 0xf9:
      state.tag = *(int *)(puVar22 + -0x28) + *(int *)(puVar22 + -0xd8);
      state.linetype = (int)puVar22[-0x80];
      state._8_4_ = SUB84(*(undefined8 *)(puVar22 + -0x24),0);
      uStack_cc = (undefined4)((ulong)*(undefined8 *)(puVar22 + -0x24) >> 0x20);
      uStack_c8 = (undefined4)*(undefined8 *)(puVar22 + -0x20);
      uStack_c4 = (undefined4)((ulong)*(undefined8 *)(puVar22 + -0x20) >> 0x20);
      val_00.flags = state.tag;
      val_00.special = state.linetype;
      val_00.args[4] = *(undefined4 *)(puVar22 + -0x1c);
      val_00.args[3] = uStack_c4;
      val_00.args[0] = state._8_4_;
      val_00.args[1] = uStack_cc;
      val_00.args[2] = uStack_c8;
      TAutoGrowArray<FLineTrans,_FLineTrans>::SetVal
                (&SimpleLineTranslations,*(uint *)(puVar22 + -0x130),val_00);
      *(undefined4 *)&pFVar3[1]._vptr_FParseContext = 0xffffffff;
      break;
    case 0xfa:
      Printf("%s, line %d: %s is undefined\n",pFVar3->SourceFile,(ulong)(uint)pFVar3->SourceLine,
             puVar22 + -0x80);
      *(undefined4 *)&pFVar3[1]._vptr_FParseContext = 0xffffffff;
      break;
    case 0xfb:
      TArray<int,_int>::Push(&XlatExpressions,(int *)(puVar22 + 4));
      state.linetype = 0;
      uVar16 = TArray<int,_int>::Push(&XlatExpressions,&state.linetype);
      goto LAB_004efe5d;
    case 0xfc:
      state.linetype = 1;
      uVar16 = TArray<int,_int>::Push(&XlatExpressions,&state.linetype);
LAB_004efe5d:
      *(uint *)(puVar22 + 4) = uVar16;
      break;
    case 0xfd:
      state.linetype = 2;
      goto LAB_004efefb;
    case 0xfe:
      state.linetype = 3;
      goto LAB_004efefb;
    case 0xff:
      state.linetype = 4;
      goto LAB_004efefb;
    case 0x100:
      state.linetype = 5;
      goto LAB_004efefb;
    case 0x101:
      state.linetype = 6;
      goto LAB_004efefb;
    case 0x102:
      state.linetype = 8;
      goto LAB_004efefb;
    case 0x103:
      state.linetype = 7;
      goto LAB_004efefb;
    case 0x104:
      state.linetype = 9;
LAB_004efefb:
      uVar16 = TArray<int,_int>::Push(&XlatExpressions,&state.linetype);
LAB_004eff1f:
      *(uint *)(puVar22 + -0x54) = uVar16;
      break;
    case 0x105:
      state.linetype = 10;
      uVar16 = TArray<int,_int>::Push(&XlatExpressions,&state.linetype);
LAB_004efea5:
      *(uint *)(puVar22 + -0x28) = uVar16;
      break;
    case 0x107:
      uVar16 = *(uint *)(puVar22 + 4);
      if ((long)XlatExpressions.Array[(int)uVar16] == 1) {
        local_b8 = (undefined8 *)0x100000000;
        TArray<int,_int>::Delete(&XlatExpressions,uVar16);
        puVar14 = local_b8;
      }
      else {
        state.linetype = *(int *)&pFVar3[1]._vptr_FParseContext;
        state.tag = 0;
        state.bIsConstant = true;
        piVar15 = (*XlatExprEval[XlatExpressions.Array[(int)uVar16]])
                            (&val,XlatExpressions.Array + (int)uVar16,&state);
        if (state.bIsConstant == true) {
          local_b8 = (undefined8 *)(ulong)(uint)val;
          if (piVar15 + 1 < XlatExpressions.Array) {
            __assert_fail("endpt >= &XlatExpressions[0]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/xlat/xlat_parser.y"
                          ,0x9b,"void yy_reduce(yyParser *, unsigned int)");
          }
          TArray<int,_int>::Resize
                    (&XlatExpressions,
                     (uint)((ulong)((long)(piVar15 + 1) - (long)XlatExpressions.Array) >> 2));
          puVar14 = local_b8;
        }
        else {
          local_b8 = (undefined8 *)CONCAT44(2,*(undefined4 *)(puVar22 + 4));
          puVar14 = local_b8;
        }
      }
      goto LAB_004f0366;
    case 0x108:
      iVar11 = *(int *)(puVar22 + 6) << 0x14;
      local_b8 = (undefined8 *)CONCAT44(1,iVar11);
      auStack_b0[0] = *(undefined4 *)(puVar22 + 4);
      auStack_b0[1] = 0;
      auStack_b0[2] = 0;
      auStack_b0[3] = 0;
      auStack_b0[4] = 0;
      puVar22[10] = 0;
      puVar22[0xb] = 0;
      puVar22[0xc] = 0;
      puVar22[0xd] = 0;
      puVar22[0xe] = 0;
      puVar22[0xf] = 0;
      puVar22[0x10] = 0;
      puVar22[0x11] = 0;
      uVar28 = 1;
      goto LAB_004efdcd;
    case 0x109:
      uVar17 = *(undefined8 *)(puVar22 + -0x54);
      auStack_b0[0] = (undefined4)*(undefined8 *)(puVar22 + -0x50);
      auStack_b0[1] = (undefined4)*(undefined8 *)(puVar22 + -0x4e);
      auStack_b0[2] = (undefined4)((ulong)*(undefined8 *)(puVar22 + -0x4e) >> 0x20);
      auStack_b0[3] = (undefined4)*(undefined8 *)(puVar22 + -0x4a);
      auStack_b0[4] = (undefined4)((ulong)*(undefined8 *)(puVar22 + -0x4a) >> 0x20);
      local_b8._4_4_ = (int)((ulong)uVar17 >> 0x20);
      iVar11 = local_b8._4_4_;
      local_b8._0_4_ = (uint)uVar17;
      if ((long)local_b8._4_4_ < 5) {
        iVar11 = *(int *)(puVar22 + 6);
        auStack_b0[local_b8._4_4_] = *(undefined4 *)(puVar22 + 4);
        local_b8 = (undefined8 *)
                   CONCAT44(local_b8._4_4_ + 1,
                            (uint)local_b8 |
                            iVar11 << ((char)((ulong)uVar17 >> 0x20) * '\x02' + 0x14U & 0x1f));
      }
      else {
        local_b8 = (undefined8 *)CONCAT44(local_b8._4_4_ + 1,(uint)local_b8);
        if (iVar11 == 5) {
          FParseContext::PrintError(pFVar3,"Line special has too many arguments\n");
        }
      }
      *(ulong *)(puVar22 + -0x4e) = CONCAT44(auStack_b0[2],auStack_b0[1]);
      *(ulong *)(puVar22 + -0x4a) = CONCAT44(auStack_b0[4],auStack_b0[3]);
      goto LAB_004f0252;
    case 0x10a:
      puVar22[0x36] = 0;
      puVar22[0x37] = 0;
      puVar22[0x38] = 0;
      puVar22[0x39] = 0;
      puVar22[0x3a] = 0;
      puVar22[0x3b] = 0;
      puVar22[0x3c] = 0;
      puVar22[0x3d] = 0;
      puVar22[0x30] = 0;
      puVar22[0x31] = 0;
      puVar22[0x32] = 0;
      puVar22[0x33] = 0;
      puVar22[0x34] = 0;
      puVar22[0x35] = 0;
      puVar22[0x36] = 0;
      puVar22[0x37] = 0;
      break;
    case 0x10b:
      local_58 = uVar26;
      lVar12 = (long)NumBoomish;
      if (lVar12 == 0x10) {
        puVar14 = *(undefined8 **)(puVar22 + -0x28);
        while (puVar14 != (undefined8 *)0x0) {
          puVar25 = (undefined8 *)*puVar14;
          operator_delete(puVar14,0x40);
          puVar14 = puVar25;
        }
        Printf("%s, line %d: Too many BOOM translators\n",pFVar3->SourceFile,
               (ulong)(uint)pFVar3->SourceLine);
        uVar26 = local_58;
      }
      else {
        Boomish[lVar12].FirstLinetype = puVar22[-0x104];
        Boomish[lVar12].LastLinetype = puVar22[-0xac];
        Boomish[lVar12].NewSpecial = (BYTE)puVar22[-0x188];
        puVar14 = *(undefined8 **)(puVar22 + -0x28);
        while (puVar14 != (undefined8 *)0x0) {
          puVar25 = (undefined8 *)*puVar14;
          TArray<FBoomArg,_FBoomArg>::Push(&Boomish[NumBoomish].Args,(FBoomArg *)(puVar14 + 1));
          operator_delete(puVar14,0x40);
          puVar14 = puVar25;
        }
        NumBoomish = NumBoomish + 1;
        uVar26 = local_58;
      }
      break;
    case 0x10c:
      puVar22[0x30] = 0;
      puVar22[0x31] = 0;
      puVar22[0x32] = 0;
      puVar22[0x33] = 0;
      break;
    case 0x10d:
      puVar14 = (undefined8 *)operator_new(0x40);
      *puVar14 = *(undefined8 *)(puVar22 + 4);
      *(undefined8 *)((long)puVar14 + 0x36) = *(undefined8 *)(puVar22 + -0x11);
      uVar28 = *(undefined4 *)(puVar22 + -0x28);
      uVar5 = *(undefined4 *)(puVar22 + -0x26);
      uVar6 = *(undefined4 *)(puVar22 + -0x24);
      uVar7 = *(undefined4 *)(puVar22 + -0x22);
      uVar17 = *(undefined8 *)(puVar22 + -0x20);
      uVar8 = *(undefined8 *)(puVar22 + -0x1c);
      uVar9 = *(undefined8 *)(puVar22 + -0x14);
      puVar14[5] = *(undefined8 *)(puVar22 + -0x18);
      puVar14[6] = uVar9;
      puVar14[3] = uVar17;
      puVar14[4] = uVar8;
      *(undefined4 *)(puVar14 + 1) = uVar28;
      *(undefined4 *)((long)puVar14 + 0xc) = uVar5;
      *(undefined4 *)(puVar14 + 2) = uVar6;
      *(undefined4 *)((long)puVar14 + 0x14) = uVar7;
      *(undefined8 **)(puVar22 + -0x28) = puVar14;
      break;
    case 0x10e:
      puVar25 = *(undefined8 **)(puVar22 + 8);
      local_b8._0_2_ = CONCAT11(puVar25 == (undefined8 *)0x0,*(int *)(puVar22 + -0x28) == 0x14);
      local_b8._0_4_ = CONCAT13((char)puVar22[-0x54],(undefined3)local_b8);
      local_b8._5_3_ = SUB83(puVar14,5);
      local_b8._0_5_ = CONCAT14((char)puVar22[4],(uint)local_b8);
      local_b8 = (undefined8 *)CONCAT26(puVar22[5],(undefined6)local_b8);
      if (puVar25 != (undefined8 *)0x0) {
        uVar24 = 0;
        local_48 = uVar23;
        while (puVar25 != (undefined8 *)0x0) {
          puVar14 = (undefined8 *)*puVar25;
          if (uVar24 < 0xf) {
            *(undefined2 *)((long)auStack_b0 + uVar24 * 2) = *(undefined2 *)(puVar25 + 1);
            *(undefined1 *)((long)&local_98 + uVar24 + 6) = *(undefined1 *)((long)puVar25 + 10);
          }
          else if (uVar24 == 0xf) {
            FParseContext::PrintError(pFVar3,"Lists can only have 15 elements");
          }
          operator_delete(puVar25,0x10);
          uVar24 = uVar24 + 1;
          puVar25 = puVar14;
        }
        uVar4 = 0xf;
        if ((uint)uVar24 < 0xf) {
          uVar4 = (undefined1)uVar24;
        }
        local_b8._0_3_ = CONCAT12(uVar4,(undefined2)local_b8);
        uVar23 = local_48;
      }
      *(ulong *)(puVar22 + -0x3d) = CONCAT62(uStack_88,uStack_8a);
      *(undefined8 *)(puVar22 + -0x44) = local_98;
      *(ulong *)(puVar22 + -0x40) = CONCAT26(uStack_8a,uStack_90);
      *(ulong *)(puVar22 + -0x4c) = CONCAT44(auStack_b0[3],auStack_b0[2]);
      *(ulong *)(puVar22 + -0x48) = CONCAT44(auStack_b0[5],auStack_b0[4]);
LAB_004f0252:
      *(uint *)(puVar22 + -0x54) = (uint)local_b8;
      *(int *)(puVar22 + -0x52) = local_b8._4_4_;
      *(undefined4 *)(puVar22 + -0x50) = auStack_b0[0];
      *(undefined4 *)(puVar22 + -0x4e) = auStack_b0[1];
      break;
    case 0x10f:
      puVar22[4] = 4;
      puVar22[5] = 0;
      break;
    case 0x110:
      puVar22[4] = 0;
      puVar22[5] = 0;
      break;
    case 0x111:
    case 0x122:
      puVar22[4] = 1;
      puVar22[5] = 0;
      break;
    case 0x112:
      puVar22[4] = 2;
      puVar22[5] = 0;
      break;
    case 0x113:
      puVar22[4] = 3;
      puVar22[5] = 0;
      break;
    case 0x114:
      puVar22[4] = 0x3d;
      puVar22[5] = 0;
      break;
    case 0x115:
      puVar22[4] = 0x14;
      puVar22[5] = 0;
      break;
    case 0x116:
      local_b8 = (undefined8 *)CONCAT71(uVar10,(char)puVar22[4]);
      auStack_b0[0] = 0;
      auStack_b0[1] = 0;
      iVar11 = (uint)local_b8;
LAB_004efdcd:
      auStack_b0[1] = 0;
      *(int *)(puVar22 + 4) = iVar11;
      *(undefined4 *)(puVar22 + 6) = uVar28;
      *(undefined4 *)(puVar22 + 8) = auStack_b0[0];
      puVar22[10] = 0;
      puVar22[0xb] = 0;
      break;
    case 0x117:
      local_b8._0_4_ = CONCAT22(puVar22[-0x80],(undefined2)local_b8);
      local_b8 = (undefined8 *)CONCAT44(uVar28,(uint)local_b8);
      auStack_b0[0] = (undefined4)*(undefined8 *)(puVar22 + -0x28);
      auStack_b0[1] = (undefined4)((ulong)*(undefined8 *)(puVar22 + -0x28) >> 0x20);
      *(uint *)(puVar22 + -0x80) = (uint)local_b8;
      *(undefined4 *)(puVar22 + -0x7e) = uVar28;
      *(undefined4 *)(puVar22 + -0x7c) = auStack_b0[0];
      *(undefined4 *)(puVar22 + -0x7a) = auStack_b0[1];
      break;
    case 0x118:
      puVar14 = (undefined8 *)operator_new(0x10);
      *puVar14 = 0;
      *(undefined4 *)(puVar14 + 1) = *(undefined4 *)(puVar22 + 4);
LAB_004f0366:
      *(undefined8 **)(puVar22 + 4) = puVar14;
      break;
    case 0x119:
      puVar14 = (undefined8 *)operator_new(0x10);
      *puVar14 = *(undefined8 *)(puVar22 + 4);
      *(undefined4 *)(puVar14 + 1) = *(undefined4 *)(puVar22 + -0x54);
      *(undefined8 **)(puVar22 + -0x54) = puVar14;
      break;
    case 0x11a:
      local_b8._0_3_ = CONCAT12((char)puVar22[4],puVar22[-0x54]);
      uVar16 = (uint)local_b8;
      goto LAB_004eff1f;
    case 0x11b:
      TArray<FLineTrans,_FLineTrans>::Resize
                (&SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>,
                 *(int *)(puVar22 + -0x28) + 1);
      break;
    case 0x11c:
      uVar16 = *(uint *)(puVar22 + -0x80);
      val_01 = (FSectorTrans)((ulong)*(uint *)(puVar22 + -0x28) | 0x100000000);
      goto LAB_004effcb;
    case 0x11d:
      Printf("Unknown constant \'%s\'\n",puVar22 + -0x28);
      break;
    case 0x11e:
      uVar16 = *(uint *)(puVar22 + -0xac);
      val_01._4_4_ = 0;
      val_01.newtype = *(uint *)(puVar22 + -0x54);
LAB_004effcb:
      TAutoGrowArray<FSectorTrans,_FSectorTrans>::SetVal(&SectorTranslations,uVar16,val_01);
      break;
    case 0x11f:
      state.linetype = *(int *)(puVar22 + -0x80);
      state.tag = *(int *)(puVar22 + -0x54);
      state._8_4_ = *(undefined4 *)(puVar22 + -0x28);
      goto LAB_004eff5c;
    case 0x120:
      state.linetype = *(int *)(puVar22 + -0x28);
      state.tag = 0;
      state.bIsConstant = false;
      state._9_3_ = 0;
      goto LAB_004eff5c;
    case 0x121:
      state.linetype = *(int *)(puVar22 + -0x54);
      state.tag = 0;
      state.bIsConstant = true;
      state._9_3_ = 0;
LAB_004eff5c:
      TArray<FSectorMask,_FSectorMask>::Push(&SectorMasks,(FSectorMask *)&state);
      break;
    case 0x123:
      puVar22[4] = 0xffff;
      puVar22[5] = 0xffff;
      break;
    case 0x124:
      if ((ulong)*(uint *)(puVar22 + -0x80) < 0x10) {
        LineFlagTranslations[*(uint *)(puVar22 + -0x80)].newvalue = *(int *)(puVar22 + -0x28);
        LineFlagTranslations[*(int *)(puVar22 + -0x80)].ismask = false;
      }
      break;
    case 0x125:
      if ((ulong)*(uint *)(puVar22 + -0x80) < 0x10) {
        LineFlagTranslations[*(uint *)(puVar22 + -0x80)].newvalue = *(int *)(puVar22 + -0x28);
        LineFlagTranslations[*(int *)(puVar22 + -0x80)].ismask = true;
      }
    }
    puVar19 = local_50;
    if (0x31 < (ulong)puVar22[uVar26 * -0x2c]) {
      __assert_fail("stateno<=YY_REDUCE_COUNT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O2/src/xlat_parser.c"
                    ,0x32f,"int yy_find_reduce_action(int, unsigned char)");
    }
    bVar1 = yyRuleInfo[uVar23].lhs;
    if (bVar1 == 0x47) {
      __assert_fail("iLookAhead!=YYNOCODE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O2/src/xlat_parser.c"
                    ,0x333,"int yy_find_reduce_action(int, unsigned char)");
    }
    uVar16 = (int)yy_reduce_ofst[puVar22[uVar26 * -0x2c]] + (uint)bVar1;
    if (0x165 < uVar16) {
      __assert_fail("i>=0 && i<YY_ACTTAB_COUNT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O2/src/xlat_parser.c"
                    ,0x33a,"int yy_find_reduce_action(int, unsigned char)");
    }
    if ("+,-./012345)*8:;\x02\x03\x04\x05\x06\a\b\t\x0f\x02\x03\x04\x05\x06\a\b\t\x02\x03\x04\x05\x06\a\b\t\x05\x06\a\b\t ABC$%&"
        [uVar16] != bVar1) {
      __assert_fail("yy_lookahead[i]==iLookAhead",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O2/src/xlat_parser.c"
                    ,0x33b,"int yy_find_reduce_action(int, unsigned char)");
    }
    if (uVar16 == 0xb) {
      *(ulong *)yyp = *yyp + uVar26 * -0x58;
      uVar17 = *(undefined8 *)((long)yyp + 0x10);
      if (yyTraceFILE != (FILE *)0x0) {
        fprintf((FILE *)yyTraceFILE,"%sAccept!\n",yyTracePrompt);
        fflush((FILE *)yyTraceFILE);
      }
      *(undefined4 *)((long)yyp + 8) = 0xffffffff;
      while (puVar19 < *yyp) {
        yy_pop_parser_stack((yyParser *)yyp);
      }
      *(undefined8 *)((long)yyp + 0x10) = uVar17;
    }
    else {
      if (uVar16 == 0x35) {
        __assert_fail("yyact == YY_ACCEPT_ACTION",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O2/src/xlat_parser.c"
                      ,0x6d1,"void yy_reduce(yyParser *, unsigned int)");
      }
      uVar2 = yy_action[uVar16];
      uVar16 = uVar2 + 0x4e;
      if (uVar2 < 100) {
        uVar16 = (uint)uVar2;
      }
      lVar12 = 1 - uVar26;
      *(ushort **)yyp = puVar22 + lVar12 * 0x2c;
      puVar22[lVar12 * 0x2c] = (ushort)uVar16;
      *(byte *)(puVar22 + lVar12 * 0x2c + 1) = bVar1;
      yyTraceShift((yyParser *)yyp,uVar16);
    }
LAB_004f00e3:
    if ((yymajor == 0x47) || (puVar22 = *yyp, puVar22 <= puVar19)) goto LAB_004f0487;
  } while( true );
}

Assistant:

void XlatParse(
  void *yyp,                   /* The parser */
  int yymajor,                 /* The major token code number */
  XlatParseTOKENTYPE yyminor       /* The value for the token */
  XlatParseARG_PDECL               /* Optional %extra_argument parameter */
){
  YYMINORTYPE yyminorunion;
  unsigned int yyact;   /* The parser action. */
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  int yyendofinput;     /* True if we are at the end of input */
#endif
#ifdef YYERRORSYMBOL
  int yyerrorhit = 0;   /* True if yymajor has invoked an error */
#endif
  yyParser *yypParser;  /* The parser */

  yypParser = (yyParser*)yyp;
  assert( yypParser->yytos!=0 );
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  yyendofinput = (yymajor==0);
#endif
  XlatParseARG_STORE;

#ifndef NDEBUG
  if( yyTraceFILE ){
    fprintf(yyTraceFILE,"%sInput '%s'\n",yyTracePrompt,yyTokenName[yymajor]);
    fflush(yyTraceFILE);
  }
#endif

  do{
    yyact = yy_find_shift_action(yypParser,(YYCODETYPE)yymajor);
    if( yyact <= YY_MAX_SHIFTREDUCE ){
      yy_shift(yypParser,yyact,yymajor,yyminor);
#ifndef YYNOERRORRECOVERY
      yypParser->yyerrcnt--;
#endif
      yymajor = YYNOCODE;
    }else if( yyact <= YY_MAX_REDUCE ){
      yy_reduce(yypParser,yyact-YY_MIN_REDUCE);
    }else{
      assert( yyact == YY_ERROR_ACTION );
      yyminorunion.yy0 = yyminor;
#ifdef YYERRORSYMBOL
      int yymx;
#endif
#ifndef NDEBUG
      if( yyTraceFILE ){
        fprintf(yyTraceFILE,"%sSyntax Error!\n",yyTracePrompt);
        fflush(yyTraceFILE);
      }
#endif
#ifdef YYERRORSYMBOL
      /* A syntax error has occurred.
      ** The response to an error depends upon whether or not the
      ** grammar defines an error token "ERROR".  
      **
      ** This is what we do if the grammar does define ERROR:
      **
      **  * Call the %syntax_error function.
      **
      **  * Begin popping the stack until we enter a state where
      **    it is legal to shift the error symbol, then shift
      **    the error symbol.
      **
      **  * Set the error count to three.
      **
      **  * Begin accepting and shifting new tokens.  No new error
      **    processing will occur until three tokens have been
      **    shifted successfully.
      **
      */
      if( yypParser->yyerrcnt<0 ){
        yy_syntax_error(yypParser,yymajor,yyminor);
      }
      yymx = yypParser->yytos->major;
      if( yymx==YYERRORSYMBOL || yyerrorhit ){
#ifndef NDEBUG
        if( yyTraceFILE ){
          fprintf(yyTraceFILE,"%sDiscard input token %s\n",
             yyTracePrompt,yyTokenName[yymajor]);
          fflush(yyTraceFILE);
        }
#endif
        yy_destructor(yypParser, (YYCODETYPE)yymajor, &yyminorunion);
        yymajor = YYNOCODE;
      }else{
        while( yypParser->yytos >= yypParser->yystack
            && yymx != YYERRORSYMBOL
            && (yyact = yy_find_reduce_action(
                        yypParser->yytos->stateno,
                        YYERRORSYMBOL)) >= YY_MIN_REDUCE
        ){
          yy_pop_parser_stack(yypParser);
        }
        if( yypParser->yytos < yypParser->yystack || yymajor==0 ){
          yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
          yy_parse_failed(yypParser);
#ifndef YYNOERRORRECOVERY
          yypParser->yyerrcnt = -1;
#endif
          yymajor = YYNOCODE;
        }else if( yymx!=YYERRORSYMBOL ){
          yy_shift(yypParser,yyact,YYERRORSYMBOL,yyminor);
        }
      }
      yypParser->yyerrcnt = 3;
      yyerrorhit = 1;
#elif defined(YYNOERRORRECOVERY)
      /* If the YYNOERRORRECOVERY macro is defined, then do not attempt to
      ** do any kind of error recovery.  Instead, simply invoke the syntax
      ** error routine and continue going as if nothing had happened.
      **
      ** Applications can set this macro (for example inside %include) if
      ** they intend to abandon the parse upon the first syntax error seen.
      */
      yy_syntax_error(yypParser,yymajor, yyminor);
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      yymajor = YYNOCODE;
      
#else  /* YYERRORSYMBOL is not defined */
      /* This is what we do if the grammar does not define ERROR:
      **
      **  * Report an error message, and throw away the input token.
      **
      **  * If the input token is $, then fail the parse.
      **
      ** As before, subsequent error messages are suppressed until
      ** three input tokens have been successfully shifted.
      */
      if( yypParser->yyerrcnt<=0 ){
        yy_syntax_error(yypParser,yymajor, yyminor);
      }
      yypParser->yyerrcnt = 3;
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      if( yyendofinput ){
        yy_parse_failed(yypParser);
#ifndef YYNOERRORRECOVERY
        yypParser->yyerrcnt = -1;
#endif
      }
      yymajor = YYNOCODE;
#endif
    }
  }while( yymajor!=YYNOCODE && yypParser->yytos>yypParser->yystack );
#ifndef NDEBUG
  if( yyTraceFILE ){
    yyStackEntry *i;
    char cDiv = '[';
    fprintf(yyTraceFILE,"%sReturn. Stack=",yyTracePrompt);
    for(i=&yypParser->yystack[1]; i<=yypParser->yytos; i++){
      fprintf(yyTraceFILE,"%c%s", cDiv, yyTokenName[i->major]);
      cDiv = ' ';
    }
    fprintf(yyTraceFILE,"]\n");
    fflush(yyTraceFILE);
  }
#endif
  return;
}